

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O0

vector<Pt2i,_std::allocator<Pt2i>_> * __thiscall BiPtList::backPoints(BiPtList *this)

{
  _Map_pointer this_00;
  vector<Pt2i,_std::allocator<Pt2i>_> *this_01;
  reference __x;
  _Self local_60;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  const_iterator it;
  vector<Pt2i,_std::allocator<Pt2i>_> *res;
  BiPtList *this_local;
  
  this_01 = (vector<Pt2i,_std::allocator<Pt2i>_> *)operator_new(0x18);
  memset(this_01,0,0x18);
  std::vector<Pt2i,_std::allocator<Pt2i>_>::vector(this_01);
  it._M_node = (_Map_pointer)this_01;
  std::deque<Pt2i,_std::allocator<Pt2i>_>::begin((const_iterator *)local_38,&this->pts);
  std::_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*>::operator+=
            ((_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*> *)local_38,(long)(this->start + 1));
  for (local_3c = 0; this_00 = it._M_node, local_3c < (this->cpt - this->start) + -1;
      local_3c = local_3c + 1) {
    std::_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*>::operator++
              (&local_60,(_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*> *)local_38,0);
    __x = std::_Deque_iterator<Pt2i,_const_Pt2i_&,_const_Pt2i_*>::operator*(&local_60);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back
              ((vector<Pt2i,_std::allocator<Pt2i>_> *)this_00,__x);
  }
  return (vector<Pt2i,_std::allocator<Pt2i>_> *)it._M_node;
}

Assistant:

std::vector<Pt2i> *BiPtList::backPoints () const
{
  std::vector<Pt2i> *res = new std::vector<Pt2i> ();
  std::deque<Pt2i>::const_iterator it = pts.begin ();
  it += start + 1;
  for (int i = 0; i < cpt - start - 1; i++) res->push_back (*it++);
  return res;
}